

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O3

bool __thiscall duckdb::CachingFileHandle::CanSeek(CachingFileHandle *this)

{
  bool bVar1;
  element_type *in_RAX;
  FileHandle *this_00;
  pointer *__ptr;
  element_type *local_18;
  
  if (((this->file_handle).
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl == (FileHandle *)0x0) &&
     (this->validate != true)) {
    local_18 = in_RAX;
    shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&(this->cached_file->lock).internals)
    ;
    StorageLockInternals::GetSharedLock((StorageLockInternals *)&stack0xffffffffffffffe8);
    bVar1 = this->cached_file->can_seek;
    if (local_18 != (element_type *)0x0) {
      StorageLockKey::~StorageLockKey((StorageLockKey *)local_18);
      operator_delete(local_18);
    }
    return bVar1;
  }
  this_00 = GetFileHandle(this);
  bVar1 = FileHandle::CanSeek(this_00);
  return bVar1;
}

Assistant:

bool CachingFileHandle::CanSeek() {
	if (file_handle || validate) {
		return GetFileHandle().CanSeek();
	}
	auto guard = cached_file.lock.GetSharedLock();
	return cached_file.CanSeek(guard);
}